

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O3

void __thiscall MemPlumberInternal::freeAllMemory(MemPlumberInternal *this)

{
  new_ptr_list_t *pnVar1;
  int index;
  long lVar2;
  new_ptr_list_t *__ptr;
  
  lVar2 = 0;
  do {
    __ptr = this->m_PointerListHashtable[lVar2];
    if (this->m_PointerListHashtable[lVar2] != (new_ptr_list_t *)0x0) {
      do {
        pnVar1 = __ptr->next;
        if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
          fprintf((FILE *)this->m_Dumper,
                  "FreeAllMem: freeing 0x%p (size %d[bytes]) allocated in %s:%d\n",__ptr + 1,
                  (ulong)(uint)__ptr->size,__ptr->file,(ulong)(uint)__ptr->line);
        }
        free(__ptr);
        __ptr = pnVar1;
      } while (pnVar1 != (new_ptr_list_t *)0x0);
      this->m_PointerListHashtable[lVar2] = (new_ptr_list_t *)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x4000);
  closeFile(this,this->m_Dumper);
  this->m_Dumper = (FILE *)0x0;
  return;
}

Assistant:

void freeAllMemory() {
        for (int index = 0; index < MEMPLUMBER_HASHTABLE_SIZE; ++index) {
            new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[index];

            // if bucket is empty - continue
            if (metaDataBucketLinkedListElement == NULL) {
                continue;
            }

            // go over all of the elements in the link list in this bucket
            while (metaDataBucketLinkedListElement != NULL) {
                new_ptr_list_t* next = metaDataBucketLinkedListElement->next;

                void* actualPointerInRecord = (char*)metaDataBucketLinkedListElement + sizeof(new_ptr_list_t);

                if (isVerbose()) {
                    fprintf(m_Dumper, "FreeAllMem: freeing 0x%p (size %d[bytes]) allocated in %s:%d\n", 
                        actualPointerInRecord,
                        (int)metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file,
                        metaDataBucketLinkedListElement->line);
                }

                // free the current element
                free(metaDataBucketLinkedListElement);

                // go to the next item on the list
                metaDataBucketLinkedListElement = next;
            }
            
            // done freeing all elements in the linked list, set the hashtable bucket to null
            m_PointerListHashtable[index] = NULL;
        }
        
        closeFile(m_Dumper);
        m_Dumper = NULL;
    }